

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV2MaterialBlock(Parser *this,Material *mat)

{
  byte bVar1;
  byte *pbVar2;
  ai_real aVar3;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> *this_00;
  ai_real *paVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  uint iNumSubMaterials;
  ai_real f;
  ai_real local_3a4;
  string local_3a0;
  ulong local_380;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> *local_378;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> *local_370;
  Texture *local_368;
  Texture *local_360;
  Texture *local_358;
  Texture *local_350;
  Texture *local_348;
  Texture *local_340;
  Texture *local_338;
  ai_real *local_330;
  ai_real *local_328;
  ai_real *local_320;
  string *local_318;
  value_type local_310;
  
  local_3a4 = 0.0;
  local_318 = &(mat->super_Material).mName;
  local_320 = &(mat->super_Material).mTransparency;
  local_328 = &(mat->super_Material).mSpecularExponent;
  local_330 = &(mat->super_Material).mShininessStrength;
  local_338 = &(mat->super_Material).sTexDiffuse;
  local_340 = &(mat->super_Material).sTexAmbient;
  local_378 = &mat->avSubMaterials;
  local_370 = &local_310.avSubMaterials;
  local_350 = &(mat->super_Material).sTexSpecular;
  local_360 = &(mat->super_Material).sTexBump;
  local_368 = &(mat->super_Material).sTexShininess;
  local_358 = &(mat->super_Material).sTexEmissive;
  local_348 = &(mat->super_Material).sTexOpacity;
  iVar8 = 0;
LAB_00410bd2:
  while (pcVar10 = this->filePtr, *pcVar10 != '*') {
LAB_00411538:
    pbVar2 = (byte *)this->filePtr;
    bVar1 = *pbVar2;
    uVar7 = (uint)bVar1;
    if (bVar1 == 0x7b) {
      iVar8 = iVar8 + 1;
    }
    else if (bVar1 == 0x7d) {
      iVar8 = iVar8 + -1;
      if (iVar8 == 0) {
        this->filePtr = (char *)(pbVar2 + 1);
        SkipToNextToken(this);
        return;
      }
    }
    else if (uVar7 == 0) {
      LogError(this,"Encountered unexpected EOL while parsing a *MATERIAL chunk (Level 2)");
    }
    if (((uVar7 < 0xe) && ((0x3401U >> (uVar7 & 0x1f) & 1) != 0)) &&
       (this->bLastWasEndLine == false)) {
      this->iLineNumber = this->iLineNumber + 1;
      this->bLastWasEndLine = true;
    }
    else {
      this->bLastWasEndLine = false;
    }
    this->filePtr = (char *)(pbVar2 + 1);
  }
  this->filePtr = pcVar10 + 1;
  iVar6 = strncmp("MATERIAL_NAME",pcVar10 + 1,0xd);
  if (iVar6 == 0) {
    bVar1 = pcVar10[0xe];
    if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_00410bff;
    pcVar11 = pcVar10 + 0xf;
    if (bVar1 == 0) {
      pcVar11 = pcVar10 + 0xe;
    }
    this->filePtr = pcVar11;
    bVar5 = ParseString(this,local_318,"*MATERIAL_NAME");
    if (!bVar5) {
LAB_00410df4:
      SkipToNextToken(this);
    }
    goto LAB_00410bd2;
  }
LAB_00410bff:
  pcVar10 = this->filePtr;
  iVar6 = strncmp("MATERIAL_AMBIENT",pcVar10,0x10);
  if (iVar6 == 0) {
    bVar1 = pcVar10[0x10];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pcVar11 = pcVar10 + 0x11;
      if (bVar1 == 0) {
        pcVar11 = pcVar10 + 0x10;
      }
      this->filePtr = pcVar11;
      lVar9 = 0;
      do {
        ParseLV4MeshFloat(this,(ai_real *)((long)&(mat->super_Material).mAmbient.r + lVar9));
        lVar9 = lVar9 + 4;
      } while (lVar9 != 0xc);
      goto LAB_00410bd2;
    }
  }
  pcVar10 = this->filePtr;
  iVar6 = strncmp("MATERIAL_DIFFUSE",pcVar10,0x10);
  if (iVar6 == 0) {
    bVar1 = pcVar10[0x10];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pcVar11 = pcVar10 + 0x11;
      if (bVar1 == 0) {
        pcVar11 = pcVar10 + 0x10;
      }
      this->filePtr = pcVar11;
      lVar9 = 0;
      do {
        ParseLV4MeshFloat(this,(ai_real *)((long)&(mat->super_Material).mDiffuse.r + lVar9));
        lVar9 = lVar9 + 4;
      } while (lVar9 != 0xc);
      goto LAB_00410bd2;
    }
  }
  pcVar10 = this->filePtr;
  iVar6 = strncmp("MATERIAL_SPECULAR",pcVar10,0x11);
  if (iVar6 == 0) {
    bVar1 = pcVar10[0x11];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pcVar11 = pcVar10 + 0x12;
      if (bVar1 == 0) {
        pcVar11 = pcVar10 + 0x11;
      }
      this->filePtr = pcVar11;
      lVar9 = 0;
      do {
        ParseLV4MeshFloat(this,(ai_real *)((long)&(mat->super_Material).mSpecular.r + lVar9));
        lVar9 = lVar9 + 4;
      } while (lVar9 != 0xc);
      goto LAB_00410bd2;
    }
  }
  pcVar10 = this->filePtr;
  iVar6 = strncmp("MATERIAL_SHADING",pcVar10,0x10);
  if (iVar6 == 0) {
    bVar1 = pcVar10[0x10];
    if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_00410c7b;
    pcVar11 = pcVar10 + 0x11;
    if (bVar1 == 0) {
      pcVar11 = pcVar10 + 0x10;
    }
    this->filePtr = pcVar11;
    iVar6 = strncmp("Blinn",pcVar11,5);
    if (iVar6 == 0) {
      bVar1 = pcVar11[5];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pcVar10 = pcVar11 + 6;
        if (bVar1 == 0) {
          pcVar10 = pcVar11 + 5;
        }
        this->filePtr = pcVar10;
        (mat->super_Material).mShading = Blinn;
        goto LAB_00410bd2;
      }
    }
    pcVar10 = this->filePtr;
    iVar6 = strncmp("Phong",pcVar10,5);
    if (iVar6 == 0) {
      bVar1 = pcVar10[5];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pcVar11 = pcVar10 + 6;
        if (bVar1 == 0) {
          pcVar11 = pcVar10 + 5;
        }
        this->filePtr = pcVar11;
        (mat->super_Material).mShading = Phong;
        goto LAB_00410bd2;
      }
    }
    pcVar10 = this->filePtr;
    iVar6 = strncmp("Flat",pcVar10,4);
    if (iVar6 == 0) {
      bVar1 = pcVar10[4];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pcVar11 = pcVar10 + 5;
        if (bVar1 == 0) {
          pcVar11 = pcVar10 + 4;
        }
        this->filePtr = pcVar11;
        (mat->super_Material).mShading = Flat;
        goto LAB_00410bd2;
      }
    }
    pcVar10 = this->filePtr;
    iVar6 = strncmp("Wire",pcVar10,4);
    if (iVar6 == 0) {
      bVar1 = pcVar10[4];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pcVar11 = pcVar10 + 5;
        if (bVar1 == 0) {
          pcVar11 = pcVar10 + 4;
        }
        this->filePtr = pcVar11;
        (mat->super_Material).mShading = Wire;
        goto LAB_00410bd2;
      }
    }
    (mat->super_Material).mShading = Gouraud;
    goto LAB_00410df4;
  }
LAB_00410c7b:
  pcVar10 = this->filePtr;
  iVar6 = strncmp("MATERIAL_TRANSPARENCY",pcVar10,0x15);
  paVar4 = local_320;
  if (iVar6 == 0) {
    bVar1 = pcVar10[0x15];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pcVar11 = pcVar10 + 0x16;
      if (bVar1 == 0) {
        pcVar11 = pcVar10 + 0x15;
      }
      this->filePtr = pcVar11;
      ParseLV4MeshFloat(this,local_320);
      *paVar4 = 1.0 - *paVar4;
      goto LAB_00410bd2;
    }
  }
  pcVar10 = this->filePtr;
  iVar6 = strncmp("MATERIAL_SELFILLUM",pcVar10,0x12);
  if (iVar6 == 0) {
    bVar1 = pcVar10[0x12];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pcVar11 = pcVar10 + 0x13;
      if (bVar1 == 0) {
        pcVar11 = pcVar10 + 0x12;
      }
      this->filePtr = pcVar11;
      local_310.super_Material._vptr_Material =
           (_func_int **)((ulong)local_310.super_Material._vptr_Material & 0xffffffff00000000);
      ParseLV4MeshFloat(this,(ai_real *)&local_310);
      (mat->super_Material).mEmissive.r = local_310.super_Material._vptr_Material._0_4_;
      (mat->super_Material).mEmissive.g = local_310.super_Material._vptr_Material._0_4_;
      (mat->super_Material).mEmissive.b = local_310.super_Material._vptr_Material._0_4_;
      goto LAB_00410bd2;
    }
  }
  pcVar10 = this->filePtr;
  iVar6 = strncmp("MATERIAL_SHINE",pcVar10,0xe);
  paVar4 = local_328;
  if (iVar6 == 0) {
    bVar1 = pcVar10[0xe];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pcVar11 = pcVar10 + 0xf;
      if (bVar1 == 0) {
        pcVar11 = pcVar10 + 0xe;
      }
      this->filePtr = pcVar11;
      ParseLV4MeshFloat(this,local_328);
      *paVar4 = *paVar4 * 15.0;
      goto LAB_00410bd2;
    }
  }
  pcVar10 = this->filePtr;
  iVar6 = strncmp("MATERIAL_TWOSIDED",pcVar10,0x11);
  if (iVar6 == 0) {
    bVar1 = pcVar10[0x11];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pcVar11 = pcVar10 + 0x12;
      if (bVar1 == 0) {
        pcVar11 = pcVar10 + 0x11;
      }
      this->filePtr = pcVar11;
      (mat->super_Material).mTwoSided = true;
      goto LAB_00410bd2;
    }
  }
  pcVar10 = this->filePtr;
  iVar6 = strncmp("MATERIAL_SHINESTRENGTH",pcVar10,0x16);
  if (iVar6 == 0) {
    bVar1 = pcVar10[0x16];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pcVar11 = pcVar10 + 0x17;
      if (bVar1 == 0) {
        pcVar11 = pcVar10 + 0x16;
      }
      this->filePtr = pcVar11;
      ParseLV4MeshFloat(this,local_330);
      goto LAB_00410bd2;
    }
  }
  pcVar10 = this->filePtr;
  iVar6 = strncmp("MAP_DIFFUSE",pcVar10,0xb);
  if (iVar6 == 0) {
    bVar1 = pcVar10[0xb];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pcVar11 = pcVar10 + 0xc;
      if (bVar1 == 0) {
        pcVar11 = pcVar10 + 0xb;
      }
      this->filePtr = pcVar11;
      ParseLV3MapBlock(this,local_338);
      goto LAB_00410bd2;
    }
  }
  pcVar10 = this->filePtr;
  iVar6 = strncmp("MAP_AMBIENT",pcVar10,0xb);
  if (iVar6 == 0) {
    bVar1 = pcVar10[0xb];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pcVar11 = pcVar10 + 0xc;
      if (bVar1 == 0) {
        pcVar11 = pcVar10 + 0xb;
      }
      this->filePtr = pcVar11;
      ParseLV3MapBlock(this,local_340);
      goto LAB_00410bd2;
    }
  }
  pcVar10 = this->filePtr;
  iVar6 = strncmp("MAP_SPECULAR",pcVar10,0xc);
  if (iVar6 == 0) {
    bVar1 = pcVar10[0xc];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pcVar11 = pcVar10 + 0xd;
      if (bVar1 == 0) {
        pcVar11 = pcVar10 + 0xc;
      }
      this->filePtr = pcVar11;
      ParseLV3MapBlock(this,local_350);
      goto LAB_00410bd2;
    }
  }
  bVar5 = TokenMatch<char_const>(&this->filePtr,"MAP_OPACITY",0xb);
  if (bVar5) {
    ParseLV3MapBlock(this,local_348);
  }
  else {
    bVar5 = TokenMatch<char_const>(&this->filePtr,"MAP_SELFILLUM",0xd);
    if (bVar5) {
      ParseLV3MapBlock(this,local_358);
    }
    else {
      bVar5 = TokenMatch<char_const>(&this->filePtr,"MAP_BUMP",8);
      if (bVar5) {
        ParseLV3MapBlock(this,local_360);
      }
      bVar5 = TokenMatch<char_const>(&this->filePtr,"MAP_SHINESTRENGTH",0x11);
      if (bVar5) {
        ParseLV3MapBlock(this,local_368);
      }
      else {
        bVar5 = TokenMatch<char_const>(&this->filePtr,"NUMSUBMTLS",10);
        if (bVar5) {
          ParseLV4MeshLong(this,(uint *)&local_3a4);
          local_380 = (ulong)(uint)local_3a4;
          local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3a0,"INVALID SUBMATERIAL","");
          D3DS::Material::Material(&local_310.super_Material,&local_3a0);
          this_00 = local_370;
          local_310.super_Material._vptr_Material = (_func_int **)&PTR__Material_0082e738;
          (local_370->
          super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          *(aiMaterial **)(local_370 + 1) = (aiMaterial *)0x0;
          (local_370->
          super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>)._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          (local_370->
          super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>)._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          *(bool *)((long)(local_370 + 1) + 8) = false;
          std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::resize
                    (local_378,local_380,&local_310);
          local_310.super_Material._vptr_Material = (_func_int **)&PTR__Material_0082e738;
          std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::~vector
                    (this_00);
          D3DS::Material::~Material(&local_310.super_Material);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
          }
        }
        bVar5 = TokenMatch<char_const>(&this->filePtr,"SUBMATERIAL",0xb);
        if (!bVar5) goto LAB_00411538;
        local_310.super_Material._vptr_Material =
             (_func_int **)((ulong)local_310.super_Material._vptr_Material & 0xffffffff00000000);
        ParseLV4MeshLong(this,(uint *)&local_310);
        aVar3 = local_3a4;
        if ((uint)local_3a4 <= (uint)local_310.super_Material._vptr_Material._0_4_) {
          LogWarning(this,"Out of range: submaterial index is too large");
          local_310.super_Material._vptr_Material =
               (_func_int **)CONCAT44(local_310.super_Material._vptr_Material._4_4_,(int)aVar3 - 1);
        }
        ParseLV2MaterialBlock
                  (this,(mat->avSubMaterials).
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                        ((ulong)local_310.super_Material._vptr_Material & 0xffffffff));
      }
    }
  }
  goto LAB_00410bd2;
}

Assistant:

void Parser::ParseLV2MaterialBlock(ASE::Material& mat)
{
    AI_ASE_PARSER_INIT();

    unsigned int iNumSubMaterials = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"MATERIAL_NAME",13))
            {
                if (!ParseString(mat.mName,"*MATERIAL_NAME"))
                    SkipToNextToken();
                continue;
            }
            // ambient material color
            if (TokenMatch(filePtr,"MATERIAL_AMBIENT",16))
            {
                ParseLV4MeshFloatTriple(&mat.mAmbient.r);
                continue;
            }
            // diffuse material color
            if (TokenMatch(filePtr,"MATERIAL_DIFFUSE",16) )
            {
                ParseLV4MeshFloatTriple(&mat.mDiffuse.r);
                continue;
            }
            // specular material color
            if (TokenMatch(filePtr,"MATERIAL_SPECULAR",17))
            {
                ParseLV4MeshFloatTriple(&mat.mSpecular.r);
                continue;
            }
            // material shading type
            if (TokenMatch(filePtr,"MATERIAL_SHADING",16))
            {
                if (TokenMatch(filePtr,"Blinn",5))
                {
                    mat.mShading = Discreet3DS::Blinn;
                }
                else if (TokenMatch(filePtr,"Phong",5))
                {
                    mat.mShading = Discreet3DS::Phong;
                }
                else if (TokenMatch(filePtr,"Flat",4))
                {
                    mat.mShading = Discreet3DS::Flat;
                }
                else if (TokenMatch(filePtr,"Wire",4))
                {
                    mat.mShading = Discreet3DS::Wire;
                }
                else
                {
                    // assume gouraud shading
                    mat.mShading = Discreet3DS::Gouraud;
                    SkipToNextToken();
                }
                continue;
            }
            // material transparency
            if (TokenMatch(filePtr,"MATERIAL_TRANSPARENCY",21))
            {
                ParseLV4MeshFloat(mat.mTransparency);
                mat.mTransparency = ai_real( 1.0 ) - mat.mTransparency;
                continue;
            }
            // material self illumination
            if (TokenMatch(filePtr,"MATERIAL_SELFILLUM",18))
            {
                ai_real f = 0.0;
                ParseLV4MeshFloat(f);

                mat.mEmissive.r = f;
                mat.mEmissive.g = f;
                mat.mEmissive.b = f;
                continue;
            }
            // material shininess
            if (TokenMatch(filePtr,"MATERIAL_SHINE",14) )
            {
                ParseLV4MeshFloat(mat.mSpecularExponent);
                mat.mSpecularExponent *= 15;
                continue;
            }
            // two-sided material
            if (TokenMatch(filePtr,"MATERIAL_TWOSIDED",17) )
            {
                mat.mTwoSided = true;
                continue;
            }
            // material shininess strength
            if (TokenMatch(filePtr,"MATERIAL_SHINESTRENGTH",22))
            {
                ParseLV4MeshFloat(mat.mShininessStrength);
                continue;
            }
            // diffuse color map
            if (TokenMatch(filePtr,"MAP_DIFFUSE",11))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexDiffuse);
                continue;
            }
            // ambient color map
            if (TokenMatch(filePtr,"MAP_AMBIENT",11))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexAmbient);
                continue;
            }
            // specular color map
            if (TokenMatch(filePtr,"MAP_SPECULAR",12))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexSpecular);
                continue;
            }
            // opacity map
            if (TokenMatch(filePtr,"MAP_OPACITY",11))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexOpacity);
                continue;
            }
            // emissive map
            if (TokenMatch(filePtr,"MAP_SELFILLUM",13))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexEmissive);
                continue;
            }
            // bump map
            if (TokenMatch(filePtr,"MAP_BUMP",8))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexBump);
            }
            // specular/shininess map
            if (TokenMatch(filePtr,"MAP_SHINESTRENGTH",17))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexShininess);
                continue;
            }
            // number of submaterials
            if (TokenMatch(filePtr,"NUMSUBMTLS",10))
            {
                ParseLV4MeshLong(iNumSubMaterials);

                // allocate enough storage
                mat.avSubMaterials.resize(iNumSubMaterials, Material("INVALID SUBMATERIAL"));
            }
            // submaterial chunks
            if (TokenMatch(filePtr,"SUBMATERIAL",11))
            {

                unsigned int iIndex = 0;
                ParseLV4MeshLong(iIndex);

                if (iIndex >= iNumSubMaterials)
                {
                    LogWarning("Out of range: submaterial index is too large");
                    iIndex = iNumSubMaterials-1;
                }

                // get a reference to the material
                Material& sMat = mat.avSubMaterials[iIndex];

                // parse the material block
                ParseLV2MaterialBlock(sMat);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","*MATERIAL");
    }
}